

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall
summarycalc::outputsummaryset(summarycalc *this,int sample_size,int summary_set,int event_id)

{
  long lVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  sampleslevelRec s;
  summarySampleslevelHeader sh;
  undefined8 local_74;
  int local_6c;
  long local_68;
  int local_5c;
  undefined4 local_58;
  float local_54;
  OASIS_FLOAT *local_50;
  ulong local_48;
  OASIS_FLOAT **local_40;
  long local_38;
  
  lVar7 = (long)summary_set;
  iVar3 = this->max_summary_id_[lVar7];
  uVar8 = (ulong)this->min_summary_id_[lVar7];
  if (this->min_summary_id_[lVar7] <= iVar3) {
    local_40 = this->sssl[lVar7];
    local_50 = this->sse[lVar7];
    local_6c = event_id;
    local_68 = lVar7;
    do {
      local_5c = local_6c;
      local_58 = (undefined4)uVar8;
      local_54 = local_50[uVar8];
      if ((0.0 < local_54) || (this->zerooutput_ == true)) {
        if ((FILE *)this->idxout[lVar7] != (FILE *)0x0) {
          fprintf((FILE *)this->idxout[lVar7],"%d,%lld\n",uVar8 & 0xffffffff,this->offset_[lVar7]);
        }
        fwrite(&local_5c,0xc,1,(FILE *)this->fout[lVar7]);
        this->offset_[lVar7] = this->offset_[lVar7] + 0xc;
        iVar4 = this->first_idx_;
        iVar5 = this->num_idx_;
        if (iVar4 <= iVar5 + sample_size) {
          local_38 = (long)iVar4 << 2;
          lVar7 = 0;
          local_48 = uVar8;
          do {
            lVar1 = local_68;
            iVar6 = iVar4 + (int)lVar7;
            if ((iVar6 != iVar5 + -4 && iVar6 != iVar5) &&
               (iVar5 = (iVar4 - iVar5) + (int)lVar7, 1 < iVar5 + 3U)) {
              fVar2 = *(float *)((long)local_40[uVar8] + lVar7 * 4 + local_38);
              local_74 = CONCAT44(fVar2,iVar5);
              if ((this->zerooutput_ != false) || ((iVar5 == -1 || (0.0 < fVar2)))) {
                fwrite(&local_74,8,1,(FILE *)this->fout[local_68]);
                this->offset_[lVar1] = this->offset_[lVar1] + 8;
                uVar8 = local_48;
              }
            }
            iVar5 = this->num_idx_;
            lVar1 = iVar4 + lVar7;
            lVar7 = lVar7 + 1;
          } while (lVar1 < iVar5 + sample_size);
        }
        lVar7 = local_68;
        local_74 = 0;
        fwrite(&local_74,8,1,(FILE *)this->fout[local_68]);
        this->offset_[lVar7] = this->offset_[lVar7] + 8;
      }
      uVar8 = uVar8 + 1;
    } while (iVar3 + 1 != (int)uVar8);
  }
  return;
}

Assistant:

void summarycalc::outputsummaryset(int sample_size, int summary_set, int event_id)
{
	OASIS_FLOAT **ssl = sssl[summary_set]; // OASIS_FLOAT **ssl two dimensional array of ssl[summary_id][sidx] to loss
	OASIS_FLOAT *se = sse[summary_set];
	int maxsummaryids = max_summary_id_[summary_set];
	int minsummaryids = min_summary_id_[summary_set];
	for (int i = minsummaryids ; i <= maxsummaryids; i++) {
		summarySampleslevelHeader sh;
		sh.event_id = event_id;
		sh.summary_id = i;
		sh.expval = se[i];
		if (sh.expval > 0 || zerooutput_ == true) {
			if (idxout[summary_set] != nullptr) {   // Fill index file
				fprintf(idxout[summary_set], "%d,%lld\n", i, offset_[summary_set]);
			}
			fwrite(&sh, sizeof(sh), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(sh);
			for (int j = first_idx_; j < sample_size + num_idx_ + 1; j++) {
				if (j != num_idx_ && j != number_of_affected_risk_idx + num_idx_) {   // sidx = 0 AND sidx = number_of_affected_risk_idx
					sampleslevelRec s;
					s.sidx = j - num_idx_;
					if (s.sidx == tiv_idx || s.sidx == std_dev_idx) {
						// skip
					}
					else {
						s.loss = ssl[i][j];
						if (zerooutput_ == false) {
							if (s.loss > 0.0 || s.sidx == mean_idx) {
								fwrite(&s, sizeof(s), 1, fout[summary_set]);
								offset_[summary_set] += sizeof(s);
							}
						}
						else {
							fwrite(&s, sizeof(s), 1, fout[summary_set]);
							offset_[summary_set] += sizeof(s);
						}

					}
				}
			}
			sampleslevelRec s;
			s.sidx = 0;
			s.loss = 0.0;
			fwrite(&s, sizeof(s), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(s);
		}
	}
}